

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PlanningUnitMADPDiscrete *this,Index johI)

{
  _func_int *p_Var1;
  long lVar2;
  Index IVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  size_type *psVar6;
  size_type sStackY_130;
  Index local_124;
  uint local_120;
  Index local_11c;
  reference local_118;
  undefined8 in_stack_fffffffffffffef0;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffef8;
  reference local_100;
  reference local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  ulong local_d8;
  ulong local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  PlanningUnitMADPDiscrete *local_b8;
  size_type *local_b0;
  Index local_a8;
  uint local_a4;
  Index this_agentOHI;
  Index agentI_2;
  Index agentI_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivIndicesThisT;
  undefined1 auStack_78 [4];
  Index ts;
  undefined8 local_68;
  uint local_4c;
  Index agentI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivO_vec;
  unsigned_long __vla_expr0;
  Index t;
  Index johI_local;
  PlanningUnitMADPDiscrete *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ohI_vec;
  
  sStackY_130 = 0x9d70da;
  local_c8 = __return_storage_ptr__;
  local_c0 = __return_storage_ptr__;
  local_b8 = this;
  IVar3 = GetTimeStepForJOHI(in_stack_fffffffffffffef8,
                             (Index)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  lVar2 = -((long)(ulong)IVar3 * 4 + 0xfU & 0xfffffffffffffff0);
  psVar6 = (size_type *)(&stack0xfffffffffffffed8 + lVar2);
  local_b0 = psVar6;
  indivO_vec.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)IVar3;
  *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7119;
  GetJointObservationHistoryArrays
            (*(PlanningUnitMADPDiscrete **)((long)&local_e0 + lVar2),
             *(Index *)((long)&local_e8 + lVar2 + 4),*(Index *)((long)&local_e8 + lVar2),
             *(Index **)((long)&local_f0 + lVar2));
  *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7122;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)((long)&sStackY_130 + lVar2));
  local_4c = 0;
  while( true ) {
    local_d8 = (ulong)local_4c;
    p_Var1 = (local_b8->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7143;
    iVar4 = (*p_Var1)();
    local_d0 = CONCAT44(extraout_var,iVar4);
    if (CONCAT44(extraout_var,iVar4) <= local_d8) break;
    _auStack_78 = (undefined1  [16])0x0;
    local_68 = 0;
    local_e0 = auStack_78;
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7180;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)&sStackY_130 + lVar2)
              );
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7190;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  **)((long)&local_120 + lVar2),(value_type *)*psVar6);
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d719b;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                (&stack0xfffffffffffffef0 + lVar2));
    local_4c = local_4c + 1;
  }
  for (indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < IVar3;
      indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7204;
    JointToIndividualObservationIndices
              (*(PlanningUnitMADPDiscrete **)((long)&local_118 + lVar2),
               *(Index *)((long)&local_11c + lVar2));
    agentI_2 = 0;
    while( true ) {
      local_f0 = (ulong)agentI_2;
      p_Var1 = (local_b8->super_PlanningUnit)._vptr_PlanningUnit[6];
      *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d722d;
      iVar4 = (*p_Var1)();
      local_e8 = CONCAT44(extraout_var_00,iVar4);
      if (CONCAT44(extraout_var_00,iVar4) <= local_f0) break;
      *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d725a;
      local_f8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::at(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        **)((long)&local_120 + lVar2),*psVar6);
      *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7277;
      local_100 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                              ((long)&local_120 + lVar2),*psVar6);
      *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7293;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                  (&stack0xfffffffffffffef0 + lVar2),
                 *(value_type_conflict1 **)((long)&local_118 + lVar2));
      agentI_2 = agentI_2 + 1;
    }
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d72d4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                (&stack0xfffffffffffffef0 + lVar2));
  }
  this_agentOHI._3_1_ = 0;
  *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d72f5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)&sStackY_130 + lVar2));
  local_a4 = 0;
  while( true ) {
    uVar5 = (ulong)local_a4;
    p_Var1 = (local_b8->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d731c;
    iVar4 = (*p_Var1)();
    if (CONCAT44(extraout_var_01,iVar4) <= uVar5) break;
    local_120 = local_a4;
    local_11c = IVar3;
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d735c;
    local_118 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::at(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       **)((long)&local_120 + lVar2),*psVar6);
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7384;
    local_124 = GetObservationHistoryIndex
                          (*(PlanningUnitMADPDiscrete **)((long)&local_100 + lVar2),
                           *(Index *)(&stack0xfffffffffffffefc + lVar2),
                           *(Index *)(&stack0xfffffffffffffef8 + lVar2),
                           *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                            (&stack0xfffffffffffffef0 + lVar2));
    local_a8 = local_124;
    *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d73ab;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                (&stack0xfffffffffffffef0 + lVar2),
               *(value_type_conflict1 **)((long)&local_118 + lVar2));
    local_a4 = local_a4 + 1;
  }
  this_agentOHI._3_1_ = 1;
  this_agentOHI._3_1_ = 1;
  *(undefined8 *)((long)&sStackY_130 + lVar2) = 0x9d7402;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)(&stack0xfffffffffffffef0 + lVar2));
  return local_c0;
}

Assistant:

vector<Index>
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices(Index
        johI) const
{
    Index t = GetTimeStepForJOHI(johI);
    Index jo_array[t];
    GetJointObservationHistoryArrays(johI, t, jo_array );

    //convert joint observations -> indiv. observations
    vector< vector<Index> > indivO_vec;
    
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        indivO_vec.push_back( vector<Index>() );

    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivIndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
            indivO_vec.at(agentI).push_back( indivIndicesThisT.at(agentI) );
    }
            
    //calculate indiv observation history index from seq. of indiv. observations
    vector<Index> ohI_vec;
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
    {
        Index this_agentOHI = GetObservationHistoryIndex(agentI, t, 
                                                     indivO_vec.at(agentI) );
        ohI_vec.push_back(this_agentOHI);
    }
    return(ohI_vec);
}